

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree234.c
# Opt level: O1

void * findrelpos234(tree234 *t,void *e,cmpfn234 cmp,int relation,int *index)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint direction;
  void *pvVar4;
  uint uVar5;
  search234_state ss;
  void *local_80;
  search234_state local_58;
  
  uVar2 = 0xffffffff;
  if (1 < relation - 1U) {
    uVar2 = (uint)(relation - 3U < 2);
  }
  uVar5 = relation & 0xfffffffd;
  if (e == (void *)0x0 && uVar5 != 1) {
    __assert_fail("!(equal_permitted && !e)",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/tree234.c"
                  ,0x218,"void *findrelpos234(tree234 *, void *, cmpfn234, int, int *)");
  }
  if (cmp == (cmpfn234)0x0) {
    cmp = t->cmp;
  }
  local_58._node = t->root;
  local_58._last = -1;
  local_58._base = 0;
  search234_step(&local_58,0);
  while (pvVar4 = local_58.element, local_58.element != (void *)0x0) {
    uVar3 = -uVar2;
    if (e != (void *)0x0) {
      uVar3 = (*cmp)(e,local_58.element);
    }
    if (uVar3 == 0 && uVar5 != 1) {
      if (index != (int *)0x0) {
        *index = local_58.index;
      }
      local_80 = pvVar4;
    }
    else {
      direction = uVar3;
      if (uVar3 == 0) {
        direction = uVar2;
      }
      search234_step(&local_58,direction);
    }
    if (uVar3 == 0 && uVar5 != 1) {
      return local_80;
    }
  }
  if (relation == 0) {
    return (void *)0x0;
  }
  if (relation - 1U < 2) {
    local_58.index = local_58.index + -1;
  }
  iVar1 = local_58.index;
  pvVar4 = index234(t,local_58.index);
  if (index == (int *)0x0 || pvVar4 == (void *)0x0) {
    return pvVar4;
  }
  *index = iVar1;
  return pvVar4;
}

Assistant:

void *findrelpos234(tree234 * t, void *e, cmpfn234 cmp,
                    int relation, int *index)
{
    search234_state ss;
    int reldir = (relation == REL234_LT || relation == REL234_LE ? -1 :
                  relation == REL234_GT || relation == REL234_GE ? +1 : 0);
    bool equal_permitted = (relation != REL234_LT && relation != REL234_GT);
    void *toret;

    /* Only LT / GT relations are permitted with a null query element. */
    assert(!(equal_permitted && !e));

    if (cmp == NULL)
        cmp = t->cmp;

    search234_start(&ss, t);
    while (ss.element) {
        int cmpret;

        if (e) {
            cmpret = cmp(e, ss.element);
        } else {
            cmpret = -reldir;          /* invent a fixed compare result */
        }

        if (cmpret == 0) {
            /*
             * We've found an element that compares exactly equal to
             * the query element.
             */
            if (equal_permitted) {
                /* If our search relation permits equality, we've
                 * finished already. */
                if (index)
                    *index = ss.index;
                return ss.element;
            } else {
                /* Otherwise, pretend this element was slightly too
                 * big/small, according to the direction of search. */
                cmpret = reldir;
            }
        }

        search234_step(&ss, cmpret);
    }

    /*
     * No element compares equal to the one we were after, but
     * ss.index indicates the index that element would have if it were
     * inserted.
     *
     * So if our search relation is EQ, we must simply return failure.
     */
    if (relation == REL234_EQ)
        return NULL;

    /*
     * Otherwise, we must do an index lookup for the previous index
     * (if we're going left - LE or LT) or this index (if we're going
     * right - GE or GT).
     */
    if (relation == REL234_LT || relation == REL234_LE) {
        ss.index--;
    }

    /*
     * We know the index of the element we want; just call index234
     * to do the rest. This will return NULL if the index is out of
     * bounds, which is exactly what we want.
     */
    toret = index234(t, ss.index);
    if (toret && index)
        *index = ss.index;
    return toret;
}